

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderRenderCase::computeFragmentReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  Vec4 *v;
  int iVar4;
  int x;
  int iVar5;
  int iVar6;
  float fVar7;
  Vec4 color;
  ShaderEvalContext evalCtx;
  RGBA local_264;
  Vec4 *local_260;
  ShaderRenderCase *local_258;
  Vector<float,_4> local_250;
  ShaderEvalContext local_240;
  
  iVar1 = result->m_width;
  iVar4 = result->m_height;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  fVar7 = (float)iVar4;
  iVar6 = 0;
  iVar3 = iVar1;
  if (iVar1 < 1) {
    iVar3 = 0;
  }
  local_260 = &this->m_clearColor;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_258 = this;
  for (; iVar6 != iVar4; iVar6 = iVar6 + 1) {
    for (iVar5 = 0; iVar3 != iVar5; iVar5 = iVar5 + 1) {
      ShaderEvalContext::reset
                (&local_240,((float)iVar5 + 0.5) / (float)iVar1,((float)iVar6 + 0.5) / fVar7);
      (*local_258->m_evaluator->_vptr_ShaderEvaluator[2])(local_258->m_evaluator,&local_240);
      v = &local_240.color;
      if (local_240.isDiscarded != false) {
        v = local_260;
      }
      tcu::Vector<float,_4>::Vector(&local_250,v);
      if (iVar2 < 1) {
        local_250.m_data[3] = 1.0;
      }
      tcu::RGBA::RGBA(&local_264,&local_250);
      *(deUint32 *)((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar6 + iVar5) * 4) =
           local_264.m_value;
    }
  }
  return;
}

Assistant:

void ShaderRenderCase::computeFragmentReference (Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int					width		= result.getWidth();
	int					height		= result.getHeight();
	bool				hasAlpha	= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext	evalCtx		(quadGrid);

	// Render.
	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		float sx = ((float)x + 0.5f) / (float)width;
		float sy = ((float)y + 0.5f) / (float)height;

		evalCtx.reset(sx, sy);
		m_evaluator.evaluate(evalCtx);
		// Select either clear color or computed color based on discarded bit.
		Vec4 color = evalCtx.isDiscarded ? m_clearColor : evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		result.setPixel(x, y, tcu::RGBA(color));
	}
}